

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catmullclark_patch.h
# Opt level: O1

int __thiscall
embree::GeneralCatmullClarkPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::init
          (GeneralCatmullClarkPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *this,
          EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  
  GeneralCatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::convert
            ((this->ring).data,(CatmullClark1Ring *)ctx);
  GeneralCatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::convert
            ((this->ring).data + 1,(CatmullClark1Ring *)(ctx + 0x340));
  GeneralCatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::convert
            ((this->ring).data + 2,(CatmullClark1Ring *)(ctx + 0x680));
  GeneralCatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::convert
            ((this->ring).data + 3,(CatmullClark1Ring *)(ctx + 0x9c0));
  return extraout_EAX;
}

Assistant:

void init(CatmullClarkPatch& patch) const
    {
      assert(size() == 4);
      ring[0].convert(patch.ring[0]);
      ring[1].convert(patch.ring[1]);
      ring[2].convert(patch.ring[2]);
      ring[3].convert(patch.ring[3]);
    }